

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  SerialArena *this_00;
  __pointer_type pcVar2;
  CleanupNode *pCVar3;
  ArenaAlign AVar4;
  CleanupNode *pCVar5;
  __pointer_type extraout_RAX;
  __pointer_type pAVar6;
  CleanupNode *pCVar7;
  __pointer_type pAVar8;
  void *pvVar9;
  long in_FS_OFFSET;
  
  if (*(uint64_t *)(in_FS_OFFSET + -0x78) != this->tag_and_id_) {
    pvVar9 = AllocateAlignedWithCleanupFallback(this,n,align,destructor);
    return pvVar9;
  }
  this_00 = *(SerialArena **)(in_FS_OFFSET + -0x70);
  AVar4 = ArenaAlignAs(align);
  pcVar2 = (this_00->ptr_)._M_b._M_p;
  if (((ulong)pcVar2 & 7) != 0) {
    AllocateAlignedWithCleanup();
LAB_00148152:
    pvVar9 = SerialArena::AllocateAlignedWithCleanupFallback(this_00,n,align,destructor);
    return pvVar9;
  }
  n = n + 7 & 0xfffffffffffffff8;
  pvVar9 = (void *)(-AVar4.align & (ulong)(pcVar2 + (AVar4.align - 1)));
  pAVar1 = (__pointer_type)((long)pvVar9 + n);
  if ((__pointer_type)this_00->limit_ < pAVar1) goto LAB_00148152;
  (this_00->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar5 = (this_00->cleanup_list_).next_;
  if ((this_00->cleanup_list_).limit_ <= pCVar5) goto LAB_0014817b;
  (this_00->cleanup_list_).next_ = pCVar5 + 1;
  pCVar5->elem = pvVar9;
  pCVar5->destructor = destructor;
  while ((pCVar5 = (CleanupNode *)(this_00->cleanup_list_).prefetch_ptr_,
         pCVar5 != (CleanupNode *)0x0 && (pCVar5 < (CleanupNode *)(this_00->cleanup_list_).head_)))
  {
    AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
LAB_0014817b:
    cleanup::ChunkList::AddFallback(&this_00->cleanup_list_,pvVar9,destructor,this_00);
  }
  pCVar3 = (this_00->cleanup_list_).next_;
  if (((long)pCVar5 - (long)pCVar3 < 0x181) &&
     (pCVar7 = (this_00->cleanup_list_).limit_, pCVar5 < pCVar7)) {
    if (pCVar3 < pCVar5) {
      pCVar3 = pCVar5;
    }
    pCVar5 = pCVar3;
    if (pCVar5 != (CleanupNode *)0x0) {
      if (pCVar5 + 0x18 < pCVar7) {
        pCVar7 = pCVar5 + 0x18;
      }
      for (; pCVar5 < pCVar7; pCVar5 = pCVar5 + 4) {
      }
      goto LAB_001480db;
    }
LAB_00148215:
    AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
LAB_0014821f:
    AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
  }
LAB_001480db:
  (this_00->cleanup_list_).prefetch_ptr_ = (char *)pCVar5;
  pAVar8 = (__pointer_type)this_00->limit_;
  if (pAVar8 < (__pointer_type)(this_00->ptr_)._M_b._M_p) {
    AllocateAlignedWithCleanup();
    pAVar6 = extraout_RAX;
  }
  else {
    pAVar6 = (__pointer_type)this_00->prefetch_ptr_;
    if ((pAVar6 != (__pointer_type)0x0) && (pAVar6 < (this_00->head_)._M_b._M_p)) {
      AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
      goto LAB_00148215;
    }
    if (0x400 < (long)pAVar6 - (long)pAVar1) goto LAB_0014811b;
  }
  if (pAVar6 < pAVar8) {
    if (pAVar1 < pAVar6) {
      pAVar1 = pAVar6;
    }
    pAVar6 = pAVar1;
    if (pAVar6 == (__pointer_type)0x0) goto LAB_0014821f;
    if (pAVar6 + 0x40 < pAVar8) {
      pAVar8 = pAVar6 + 0x40;
    }
    for (; pAVar6 < pAVar8; pAVar6 = pAVar6 + 4) {
    }
  }
LAB_0014811b:
  this_00->prefetch_ptr_ = (char *)pAVar6;
  return pvVar9;
}

Assistant:

void* ThreadSafeArena::AllocateAlignedWithCleanup(size_t n, size_t align,
                                                  void (*destructor)(void*)) {
  SerialArena* arena;
  if (ABSL_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, align, destructor);
  } else {
    return AllocateAlignedWithCleanupFallback(n, align, destructor);
  }
}